

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void __thiscall
duckdb_re2::CharClassBuilder::AddCharClass(CharClassBuilder *this,CharClassBuilder *cc)

{
  bool bVar1;
  pointer pRVar2;
  iterator it;
  Rune in_stack_000000e0;
  Rune in_stack_000000e4;
  CharClassBuilder *in_stack_000000e8;
  CharClassBuilder *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  Rune RVar3;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node = (_Base_ptr)begin(in_stack_ffffffffffffffc8);
  while( true ) {
    local_20._M_node = (_Base_ptr)end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(local_18,&local_20);
    if (!bVar1) break;
    pRVar2 = std::_Rb_tree_const_iterator<duckdb_re2::RuneRange>::operator->
                       ((_Rb_tree_const_iterator<duckdb_re2::RuneRange> *)0x2600525);
    RVar3 = pRVar2->lo;
    std::_Rb_tree_const_iterator<duckdb_re2::RuneRange>::operator->
              ((_Rb_tree_const_iterator<duckdb_re2::RuneRange> *)0x2600535);
    AddRange(in_stack_000000e8,in_stack_000000e4,in_stack_000000e0);
    std::_Rb_tree_const_iterator<duckdb_re2::RuneRange>::operator++
              ((_Rb_tree_const_iterator<duckdb_re2::RuneRange> *)
               CONCAT44(RVar3,in_stack_ffffffffffffffd0));
  }
  return;
}

Assistant:

void CharClassBuilder::AddCharClass(CharClassBuilder *cc) {
  for (iterator it = cc->begin(); it != cc->end(); ++it)
    AddRange(it->lo, it->hi);
}